

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::csdashroll(Forth *this)

{
  uint uVar1;
  uint Value;
  ForthStack<unsigned_int> *this_00;
  size_t index;
  
  requireDStackDepth(this,1,"CS-ROLL");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (uVar1 != 0) {
    requireCStackDepth(this,(ulong)(uVar1 + 1),"CS-ROLL");
    this_00 = &this->controlStackIf_Begin;
    index = (size_t)uVar1;
    uVar1 = ForthStack<unsigned_int>::getTop(this_00,index);
    do {
      Value = ForthStack<unsigned_int>::getTop(this_00,index - 1);
      ForthStack<unsigned_int>::setTop(this_00,index,Value);
      index = index - 1;
    } while (index != 0);
    ForthStack<unsigned_int>::setTop(this_00,uVar1);
    return;
  }
  return;
}

Assistant:

void csdashroll() {
			REQUIRE_DSTACK_DEPTH(1, "CS-ROLL");
			auto index = dStack.getTop(); pop();
			if(index>0){
			REQUIRE_CSTACK_DEPTH(index+1, "CS-ROLL");
			 auto newTop=controlStackIf_Begin.getTop(index);
			 for(auto i=index;i>0;--i){
			  controlStackIf_Begin.setTop(i,controlStackIf_Begin.getTop(i-1));
			 }
			 controlStackIf_Begin.setTop(newTop);
			}
			//auto cell = controlStackLoops.getTop(); controlStackLoops.pop();
		}